

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

var * __thiscall cs::domain_type::get_var(domain_type *this,string *name)

{
  size_t sVar1;
  MappedConstReference<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char>,_unsigned_long>_>
  puVar2;
  const_reference pvVar3;
  string *str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  runtime_error *in_stack_ffffffffffffff90;
  key_arg<std::__cxx11::basic_string<char>_> *in_stack_ffffffffffffffa8;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  
  sVar1 = phmap::priv::
          raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
          ::count<std::__cxx11::string>(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (sVar1 != 0) {
    in_RDI = in_RDI + 2;
    puVar2 = phmap::priv::
             raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
             ::
             at<std::__cxx11::string,phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>>
                       ((raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                         *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    pvVar3 = std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[]
                       ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_RDI,*puVar2);
    return pvVar3;
  }
  str = (string *)__cxa_allocate_exception(0x28);
  std::operator+(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::operator+(in_RDI,(char *)in_stack_ffffffffffffff90);
  runtime_error::runtime_error(in_stack_ffffffffffffff90,str);
  __cxa_throw(str,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

const var &get_var(const std::string &name) const
		{
			if (m_reflect.count(name) > 0)
				return m_slot[m_reflect.at(name)];
			else
				throw runtime_error("Use of undefined variable \"" + name + "\".");
		}